

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::TraceInstruction
          (UpgradeMemoryModel *this,Instruction *inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited)

{
  iterator this_00;
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t type_id;
  pointer ppVar4;
  mapped_type *pmVar5;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  anon_class_40_5_a265a1e7 local_140;
  function<void_(unsigned_int_*)> local_118;
  bool local_f2;
  bool local_f1;
  uint32_t local_f0;
  uint local_ec;
  uint32_t local_e8;
  uint32_t i_1;
  tuple<bool&,bool&> local_e0 [4];
  uint32_t i;
  pair<bool,_bool> local_ca;
  byte local_c8;
  bool local_c7;
  bool local_c6;
  bool local_c5;
  uint32_t local_c4;
  bool type_volatile;
  bool type_coherent;
  bool is_volatile;
  bool is_coherent;
  mapped_type *local_a0;
  mapped_type *cached_result;
  _Node_iterator_base<unsigned_int,_false> local_90;
  byte local_88;
  uint32_t local_7c;
  _Node_iterator_base<unsigned_int,_false> local_78;
  byte local_70;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
  local_68;
  uint32_t local_5c;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_58;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
  local_38;
  iterator iter;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *visited_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_local;
  Instruction *inst_local;
  UpgradeMemoryModel *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
               )visited;
  local_5c = Instruction::result_id(inst);
  std::make_pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
            (&local_58,&local_5c,indices);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>,_spvtools::opt::CacheHash,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>_>
       ::find(&this->cache_,&local_58);
  std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
            (&local_58);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>,_spvtools::opt::CacheHash,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>_>
       ::end(&this->cache_);
  bVar1 = std::__detail::operator!=(&local_38,&local_68);
  this_00 = iter;
  if (bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_false,_true>
                           *)&local_38);
    this_local._6_2_ = ppVar4->second;
  }
  else {
    local_7c = Instruction::result_id(inst);
    pVar6 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)this_00.
                        super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
                        ._M_cur,&local_7c);
    local_90._M_cur =
         (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_88 = pVar6.second;
    local_78._M_cur = local_90._M_cur;
    local_70 = local_88;
    if (((local_88 ^ 0xff) & 1) == 0) {
      local_c4 = Instruction::result_id(inst);
      std::make_pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
                ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &type_volatile,&local_c4,indices);
      pmVar5 = std::
               unordered_map<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>,_spvtools::opt::CacheHash,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>_>
               ::operator[](&this->cache_,
                            (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)&type_volatile);
      std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
                ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &type_volatile);
      pmVar5->first = false;
      pmVar5->second = false;
      local_c5 = false;
      local_c6 = false;
      local_a0 = pmVar5;
      OVar3 = Instruction::opcode(inst);
      switch(OVar3) {
      case OpFunctionParameter:
      case OpVariable:
        bVar1 = HasDecoration(this,inst,0,Coherent);
        local_c5 = (local_c5 & 1U) != 0 || bVar1;
        bVar2 = HasDecoration(this,inst,0,Volatile);
        bVar1 = (local_c6 & 1U) != 0;
        local_c6 = bVar1 || bVar2;
        if (((local_c5 & 1U) == 0) || (!bVar1 && !bVar2)) {
          local_c7 = false;
          local_c8 = 0;
          type_id = Instruction::type_id(inst);
          local_ca = CheckType(this,type_id,indices);
          std::tie<bool,bool>((bool *)local_e0,&local_c7);
          std::tuple<bool&,bool&>::operator=(local_e0,&local_ca);
          local_c5 = (local_c5 & 1U) != 0 || (local_c7 & 1U) != 0;
          local_c6 = (local_c6 & 1U) != 0 || (local_c8 & 1) != 0;
        }
        break;
      default:
        break;
      case OpAccessChain:
      case OpInBoundsAccessChain:
        i_1 = Instruction::NumInOperands(inst);
        while (i_1 = i_1 - 1, i_1 != 0) {
          local_e8 = Instruction::GetSingleWordInOperand(inst,i_1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(indices,&local_e8);
        }
        break;
      case OpPtrAccessChain:
        local_ec = Instruction::NumInOperands(inst);
        while (local_ec = local_ec - 1, 1 < local_ec) {
          local_f0 = Instruction::GetSingleWordInOperand(inst,local_ec);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(indices,&local_f0);
        }
      }
      if (((local_c5 & 1U) == 0) || ((local_c6 & 1U) == 0)) {
        OVar3 = Instruction::opcode(inst);
        if ((OVar3 != OpVariable) &&
           (OVar3 = Instruction::opcode(inst), OVar3 != OpFunctionParameter)) {
          local_140.is_coherent = &local_c5;
          local_140.is_volatile = &local_c6;
          local_140.visited =
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                **)&iter;
          local_140.this = this;
          local_140.indices = indices;
          std::function<void(unsigned_int*)>::
          function<spvtools::opt::UpgradeMemoryModel::TraceInstruction(spvtools::opt::Instruction*,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>*)::__0,void>
                    ((function<void(unsigned_int*)> *)&local_118,&local_140);
          Instruction::ForEachInId(inst,&local_118);
          std::function<void_(unsigned_int_*)>::~function(&local_118);
        }
        local_a0->first = (bool)(local_c5 & 1);
        local_a0->second = (bool)(local_c6 & 1);
        this_local._6_2_ = std::make_pair<bool&,bool&>(&local_c5,&local_c6);
      }
      else {
        local_a0->first = true;
        local_a0->second = true;
        local_f1 = true;
        local_f2 = true;
        this_local._6_2_ = std::make_pair<bool,bool>(&local_f1,&local_f2);
      }
    }
    else {
      cached_result._7_1_ = 0;
      cached_result._6_1_ = 0;
      this_local._6_2_ =
           std::make_pair<bool,bool>
                     ((bool *)((long)&cached_result + 7),(bool *)((long)&cached_result + 6));
    }
  }
  return this_local._6_2_;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::TraceInstruction(
    Instruction* inst, std::vector<uint32_t> indices,
    std::unordered_set<uint32_t>* visited) {
  auto iter = cache_.find(std::make_pair(inst->result_id(), indices));
  if (iter != cache_.end()) {
    return iter->second;
  }

  if (!visited->insert(inst->result_id()).second) {
    return std::make_pair(false, false);
  }

  // Initialize the cache before |indices| is (potentially) modified.
  auto& cached_result = cache_[std::make_pair(inst->result_id(), indices)];
  cached_result.first = false;
  cached_result.second = false;

  bool is_coherent = false;
  bool is_volatile = false;
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpFunctionParameter:
      is_coherent |= HasDecoration(inst, 0, spv::Decoration::Coherent);
      is_volatile |= HasDecoration(inst, 0, spv::Decoration::Volatile);
      if (!is_coherent || !is_volatile) {
        bool type_coherent = false;
        bool type_volatile = false;
        std::tie(type_coherent, type_volatile) =
            CheckType(inst->type_id(), indices);
        is_coherent |= type_coherent;
        is_volatile |= type_volatile;
      }
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
      // Store indices in reverse order.
      for (uint32_t i = inst->NumInOperands() - 1; i > 0; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    case spv::Op::OpPtrAccessChain:
      // Store indices in reverse order. Skip the |Element| operand.
      for (uint32_t i = inst->NumInOperands() - 1; i > 1; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    default:
      break;
  }

  // No point searching further.
  if (is_coherent && is_volatile) {
    cached_result.first = true;
    cached_result.second = true;
    return std::make_pair(true, true);
  }

  // Variables and function parameters are sources. Continue searching until we
  // reach them.
  if (inst->opcode() != spv::Op::OpVariable &&
      inst->opcode() != spv::Op::OpFunctionParameter) {
    inst->ForEachInId([this, &is_coherent, &is_volatile, &indices,
                       &visited](const uint32_t* id_ptr) {
      Instruction* op_inst = context()->get_def_use_mgr()->GetDef(*id_ptr);
      const analysis::Type* type =
          context()->get_type_mgr()->GetType(op_inst->type_id());
      if (type &&
          (type->AsPointer() || type->AsImage() || type->AsSampledImage())) {
        bool operand_coherent = false;
        bool operand_volatile = false;
        std::tie(operand_coherent, operand_volatile) =
            TraceInstruction(op_inst, indices, visited);
        is_coherent |= operand_coherent;
        is_volatile |= operand_volatile;
      }
    });
  }

  cached_result.first = is_coherent;
  cached_result.second = is_volatile;
  return std::make_pair(is_coherent, is_volatile);
}